

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

int __thiscall rcg::System::open(System *this,char *__file,int __oflag,...)

{
  GC_ERROR GVar1;
  int extraout_EAX;
  element_type *peVar2;
  undefined8 uVar3;
  lock_guard<std::recursive_mutex> lock;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_000005b0;
  string *in_stack_000005b8;
  GenTLException *in_stack_000005c0;
  mutex_type *in_stack_ffffffffffffff98;
  lock_guard<std::recursive_mutex> *in_stack_ffffffffffffffa0;
  allocator *paVar4;
  allocator local_41;
  string local_40 [56];
  System *local_8;
  
  local_8 = this;
  std::lock_guard<std::recursive_mutex>::lock_guard
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (this->n_open == 0) {
    peVar2 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10afee);
    GVar1 = (*peVar2->TLOpen)(&this->tl);
    if (GVar1 != 0) {
      uVar3 = __cxa_allocate_exception(0x28);
      paVar4 = &local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"System::open()",paVar4);
      GenTLException::GenTLException(in_stack_000005c0,in_stack_000005b8,in_stack_000005b0);
      __cxa_throw(uVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
  }
  this->n_open = this->n_open + 1;
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x10b0f4);
  return extraout_EAX;
}

Assistant:

void System::open()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  if (n_open == 0)
  {
    if (gentl->TLOpen(&tl) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("System::open()", gentl);
    }
  }

  n_open++;
}